

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfAttribute.h
# Opt level: O3

Attribute * Imf_3_4::TypedAttribute<Imath_3_2::Matrix44<float>_>::makeNewAttribute(void)

{
  Attribute *this;
  
  this = (Attribute *)operator_new(0x48);
  this->_vptr_Attribute = (_func_int **)0x0;
  this[1]._vptr_Attribute = (_func_int **)0x0;
  this[2]._vptr_Attribute = (_func_int **)0x0;
  this[3]._vptr_Attribute = (_func_int **)0x0;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  this[5]._vptr_Attribute = (_func_int **)0x0;
  this[6]._vptr_Attribute = (_func_int **)0x0;
  this[7]._vptr_Attribute = (_func_int **)0x0;
  this[8]._vptr_Attribute = (_func_int **)0x0;
  Attribute::Attribute(this);
  this->_vptr_Attribute = (_func_int **)&PTR__TypedAttribute_001e3900;
  *(undefined4 *)&this[1]._vptr_Attribute = 0x3f800000;
  *(undefined8 *)((long)&this[1]._vptr_Attribute + 4) = 0;
  *(undefined8 *)((long)&this[2]._vptr_Attribute + 4) = 0;
  *(undefined4 *)((long)&this[3]._vptr_Attribute + 4) = 0x3f800000;
  this[4]._vptr_Attribute = (_func_int **)0x0;
  this[5]._vptr_Attribute = (_func_int **)0x0;
  *(undefined4 *)&this[6]._vptr_Attribute = 0x3f800000;
  *(undefined8 *)((long)&this[6]._vptr_Attribute + 4) = 0;
  *(undefined8 *)((long)&this[7]._vptr_Attribute + 4) = 0;
  *(undefined4 *)((long)&this[8]._vptr_Attribute + 4) = 0x3f800000;
  return this;
}

Assistant:

Attribute*
TypedAttribute<T>::makeNewAttribute ()
{
    return new TypedAttribute<T> ();
}